

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O1

bool __thiscall
ArgsManager::ReadConfigStream
          (ArgsManager *this,istream *stream,string *filepath,string *error,bool ignore_invalid_keys
          )

{
  list<SectionInfo,_std::allocator<SectionInfo>_> *__position;
  uint uVar1;
  pointer pcVar2;
  pointer pcVar3;
  string key;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__n;
  size_type sVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  istream *piVar9;
  void *pvVar10;
  size_type sVar11;
  ulong uVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  optional<unsigned_int> oVar14;
  mapped_type *this_00;
  mapped_type *this_01;
  undefined8 uVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__n_00;
  pointer fmt;
  char *pcVar16;
  undefined7 in_register_00000081;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  size_type sVar17;
  char *__data;
  char *pcVar18;
  size_type __size;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  _Alloc_hider _Var22;
  long in_FS_OFFSET;
  bool bVar23;
  string_view logging_function;
  string_view source_file;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  string_view value;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  optional<UniValue> value_1;
  string str;
  string name;
  string prefix;
  Level in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  char *in_stack_fffffffffffffe30;
  pointer ppVar24;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_188;
  int local_164;
  basic_string_view<char,_std::char_traits<char>_> local_160;
  unique_lock<std::recursive_mutex> local_150;
  undefined1 local_140 [32];
  string local_120 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110 [2];
  bool local_e8;
  long *local_e0 [2];
  long local_d0 [2];
  KeyInfo local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT71(in_register_00000081,ignore_invalid_keys);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_150._M_owns = false;
  local_150._M_device = (mutex_type *)this;
  std::unique_lock<std::recursive_mutex>::lock(&local_150);
  local_188.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __position = &this->m_config_sections;
  local_c0.name._M_dataplus._M_p = (pointer)&local_c0.name.field_2;
  local_c0.name._M_string_length = 0;
  local_c0.name.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_164 = 1;
  while( true ) {
    cVar6 = std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + (char)stream);
    piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (stream,(string *)&local_c0,cVar6);
    _Var22._M_p = local_c0.name._M_dataplus._M_p;
    pcVar16 = *(char **)(*(long *)piVar9 + -0x18);
    uVar1 = *(uint *)(piVar9 + 0x20 + (long)pcVar16);
    if ((uVar1 & 5) != 0) break;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.name._M_string_length ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      sVar17 = 0xffffffffffffffff;
    }
    else {
      pvVar10 = memchr(local_c0.name._M_dataplus._M_p,0x23,local_c0.name._M_string_length);
      sVar17 = -(ulong)(pvVar10 == (void *)0x0) | (long)pvVar10 - (long)_Var22._M_p;
    }
    if (sVar17 != 0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                 &local_c0.name,0,sVar17);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_c0.name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
      if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
        operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
      }
    }
    if (GetConfigOptions(std::istream&,std::__cxx11::string_const&,std::__cxx11::string&,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>&,std::__cxx11::list<SectionInfo,std::allocator<SectionInfo>>&)
        ::pattern_abi_cxx11_ == '\0') {
      ReadConfigStream();
    }
    sVar5 = local_c0.name._M_string_length;
    _Var22._M_p = local_c0.name._M_dataplus._M_p;
    paVar20 = DAT_00b4dfe0;
    paVar19 = GetConfigOptions(std::istream&,std::__cxx11::string_const&,std::__cxx11::string&,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>&,std::__cxx11::list<SectionInfo,std::allocator<SectionInfo>>&)
              ::pattern_abi_cxx11_;
    local_78._M_dataplus._M_p = (pointer)local_c0.name._M_string_length;
    local_78._M_string_length = (size_type)local_c0.name._M_dataplus._M_p;
    pcVar16 = (char *)0xffffffffffffffff;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.name._M_string_length !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      if (DAT_00b4dfe0 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        pcVar16 = (char *)0x0;
      }
      else {
        pcVar18 = (char *)0x0;
        do {
          pvVar10 = memchr(paVar19,(int)_Var22._M_p[(long)pcVar18],(size_t)paVar20);
          pcVar16 = pcVar18;
          if (pvVar10 == (void *)0x0) break;
          pcVar18 = pcVar18 + 1;
          pcVar16 = (char *)0xffffffffffffffff;
        } while ((char *)sVar5 != pcVar18);
      }
    }
    if (pcVar16 != (char *)0xffffffffffffffff) {
      sVar11 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                         ((basic_string_view<char,_std::char_traits<char>_> *)&local_78,
                          paVar19->_M_local_buf,0xffffffffffffffff,(size_type)paVar20);
      if (pcVar16 <= local_78._M_dataplus._M_p) {
        uVar12 = (sVar11 - (long)pcVar16) + 1;
        if ((ulong)((long)local_78._M_dataplus._M_p - (long)pcVar16) < uVar12) {
          uVar12 = (long)local_78._M_dataplus._M_p - (long)pcVar16;
        }
        pcVar16 = pcVar16 + local_78._M_string_length;
        goto LAB_006a2ebd;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   pcVar16);
        goto LAB_006a3a15;
      }
      goto LAB_006a3cd8;
    }
    uVar12 = 0;
    pcVar16 = (char *)0x0;
LAB_006a2ebd:
    paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_140 + 0x10);
    local_140._0_8_ = paVar19;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_140,pcVar16,pcVar16 + uVar12);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_c0.name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._0_8_ != paVar19) {
      operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
    }
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0.name._M_string_length;
    _Var22._M_p = local_c0.name._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.name._M_string_length !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      if (*local_c0.name._M_dataplus._M_p != '[') {
        if (*local_c0.name._M_dataplus._M_p != '-') goto LAB_006a2f47;
        pcVar16 = (char *)&local_c0;
        tinyformat::format<int,std::__cxx11::string>
                  ((string *)local_140,
                   (tinyformat *)
                   "parse error on line %i: %s, options in configuration file must be specified without leading -"
                   ,(char *)&local_164,(int *)pcVar16,args_1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_140);
        uVar15 = local_140._16_8_;
        _Var22._M_p = (pointer)local_140._0_8_;
        if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
LAB_006a36ad:
          operator_delete(_Var22._M_p,uVar15 + 1);
        }
        break;
      }
      if ((local_c0.name._M_dataplus._M_p + -1)[local_c0.name._M_string_length] == ']') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_78,&local_c0.name,1,(size_type)(local_c0.name._M_string_length + -2));
        local_140._0_8_ = paVar19;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_140,local_78._M_dataplus._M_p,
                   local_78._M_dataplus._M_p + (long)(_Alloc_hider *)local_78._M_string_length);
        local_120._0_8_ = local_110;
        pcVar2 = (filepath->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  (local_120,pcVar2,pcVar2 + filepath->_M_string_length);
        local_110[1]._0_4_ = local_164;
        std::__cxx11::list<SectionInfo,_std::allocator<SectionInfo>_>::_M_insert<SectionInfo>
                  (__position,(iterator)__position,(SectionInfo *)local_140);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._0_8_ != local_110) {
          operator_delete((void *)local_120._0_8_,local_110[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._0_8_ != paVar19) {
          operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
        }
        local_140._0_8_ = paVar19;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_140,local_78._M_dataplus._M_p,
                   local_78._M_dataplus._M_p + (long)(_Alloc_hider *)local_78._M_string_length);
        args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_replace_aux((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_140,local_140._8_8_,0,1,'.');
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._0_8_ != paVar19) {
          operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        goto LAB_006a3301;
      }
LAB_006a2f47:
      pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                memchr(local_c0.name._M_dataplus._M_p,0x3d,local_c0.name._M_string_length);
      paVar19 = DAT_00b4dfe0;
      paVar4 = GetConfigOptions(std::istream&,std::__cxx11::string_const&,std::__cxx11::string&,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>&,std::__cxx11::list<SectionInfo,std::allocator<SectionInfo>>&)
               ::pattern_abi_cxx11_;
      if ((pbVar13 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
         (paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)pbVar13 - (long)_Var22._M_p),
         paVar21 !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0xffffffffffffffff)) {
        if (paVar21 <= paVar20) {
          paVar20 = paVar21;
        }
        local_160._M_str = _Var22._M_p;
        pcVar16 = (char *)0xffffffffffffffff;
        local_160._M_len = (size_t)paVar20;
        if ((pbVar13 !=
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var22._M_p) &&
           (pcVar16 = (char *)0x0,
           DAT_00b4dfe0 !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0)) {
          do {
            pvVar10 = memchr(paVar4,(int)_Var22._M_p[(long)pcVar16],(size_t)paVar19);
            if (pvVar10 == (void *)0x0) goto LAB_006a2fca;
            pcVar16 = pcVar16 + 1;
          } while (paVar20 !=
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)pcVar16);
          pcVar16 = (char *)0xffffffffffffffff;
        }
LAB_006a2fca:
        if (pcVar16 == (char *)0xffffffffffffffff) {
          uVar12 = 0;
          pcVar16 = (char *)0x0;
LAB_006a301b:
          paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_140 + 0x10);
          local_140._0_8_ = paVar19;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_140,pcVar16,pcVar16 + uVar12);
          args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_58._M_string_length;
          pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_140,0,0,local_58._M_dataplus._M_p,local_58._M_string_length);
          local_78._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
          paVar20 = &pbVar13->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p == paVar20) {
            local_78.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
            local_78.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
            local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          }
          else {
            local_78.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
          }
          local_78._M_string_length = pbVar13->_M_string_length;
          (pbVar13->_M_dataplus)._M_p = (pointer)paVar20;
          pbVar13->_M_string_length = 0;
          (pbVar13->field_2)._M_local_buf[0] = '\0';
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._0_8_ != paVar19) {
            operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
          }
          __n = DAT_00b4dfe0;
          paVar4 = GetConfigOptions(std::istream&,std::__cxx11::string_const&,std::__cxx11::string&,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>&,std::__cxx11::list<SectionInfo,std::allocator<SectionInfo>>&)
                   ::pattern_abi_cxx11_;
          pcVar16 = (char *)((long)paVar21 + 1);
          paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c0.name._M_string_length;
          if (paVar21 < local_c0.name._M_string_length) {
            _Var22._M_p = local_c0.name._M_dataplus._M_p + (long)pcVar16;
            paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_c0.name._M_string_length + -(long)pcVar16);
            pcVar16 = (char *)0xffffffffffffffff;
            local_140._0_8_ = paVar19;
            local_140._8_8_ = _Var22._M_p;
            if (paVar19 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              if (DAT_00b4dfe0 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                pcVar16 = (char *)0x0;
              }
              else {
                pcVar18 = (char *)0x0;
                do {
                  pvVar10 = memchr(paVar4,(int)_Var22._M_p[(long)pcVar18],(size_t)__n);
                  pcVar16 = pcVar18;
                  if (pvVar10 == (void *)0x0) break;
                  pcVar18 = pcVar18 + 1;
                  pcVar16 = (char *)0xffffffffffffffff;
                } while (paVar19 !=
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)pcVar18);
              }
            }
            if (pcVar16 == (char *)0xffffffffffffffff) {
              local_160._M_len = 0;
              local_160._M_str = (char *)0x0;
            }
            else {
              sVar11 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                                 ((basic_string_view<char,_std::char_traits<char>_> *)local_140,
                                  paVar4->_M_local_buf,0xffffffffffffffff,(size_type)__n);
              paVar19 = __n;
              paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_140._0_8_;
              if ((ulong)local_140._0_8_ < pcVar16) goto LAB_006a3a15;
              local_160._M_len = (sVar11 - (long)pcVar16) + 1;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_140._0_8_ - (long)pcVar16) < local_160._M_len) {
                local_160._M_len = (size_t)(local_140._0_8_ - (long)pcVar16);
              }
              local_160._M_str = pcVar16 + local_140._8_8_;
            }
            if (sVar17 != 0xffffffffffffffff) {
              pcVar16 = (char *)0xb;
              sVar17 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                 (&local_78,"rpcpassword",0,0xb);
              if (sVar17 != 0xffffffffffffffff) {
                tinyformat::format<int>
                          ((string *)local_140,
                           "parse error on line %i, using # in rpcpassword can be ambiguous and should be avoided"
                           ,&local_164);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_140);
                if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
                  operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
                }
                uVar15 = local_78.field_2._M_allocated_capacity;
                _Var22._M_p = local_78._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p != &local_78.field_2) goto LAB_006a36ad;
                break;
              }
            }
            std::
            vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
            ::
            emplace_back<std::__cxx11::string&,std::basic_string_view<char,std::char_traits<char>>&>
                      ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                        *)&local_188,&local_78,&local_160);
            pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_78._M_string_length;
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_78._M_string_length ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
LAB_006a3227:
              __n_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       0xffffffffffffffff;
            }
            else {
              do {
                __n_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&pbVar13[-1].field_2._M_allocated_capacity + 0xf);
                if (pbVar13 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                goto LAB_006a3227;
                pcVar16 = local_78._M_dataplus._M_p + -1 + (long)pbVar13;
                pbVar13 = __n_00;
              } while (*pcVar16 != '.');
            }
            if ((__n_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0xffffffffffffffff) && (local_58._M_string_length <= __n_00)) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                     &local_78,0,(size_type)__n_00);
              local_120._0_8_ = local_110;
              pcVar2 = (filepath->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        (local_120,pcVar2,pcVar2 + filepath->_M_string_length);
              local_110[1]._0_4_ = local_164;
              std::__cxx11::list<SectionInfo,_std::allocator<SectionInfo>_>::_M_insert<SectionInfo>
                        (__position,(iterator)__position,(SectionInfo *)local_140);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._0_8_ != local_110) {
                operator_delete((void *)local_120._0_8_,local_110[0]._M_allocated_capacity + 1);
              }
              if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
                operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            goto LAB_006a3301;
          }
LAB_006a3a15:
          if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_006a3cd8;
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     pcVar16,paVar20);
        }
        else {
          sVar11 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                             (&local_160,paVar4->_M_local_buf,0xffffffffffffffff,(size_type)paVar19)
          ;
          if (pcVar16 <= local_160._M_len) {
            uVar12 = (sVar11 - (long)pcVar16) + 1;
            if (local_160._M_len - (long)pcVar16 < uVar12) {
              uVar12 = local_160._M_len - (long)pcVar16;
            }
            pcVar16 = pcVar16 + (long)local_160._M_str;
            goto LAB_006a301b;
          }
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          uVar15 = std::__throw_out_of_range_fmt
                             ("%s: __pos (which is %zu) > __size (which is %zu)",
                              "basic_string_view::substr",pcVar16);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._0_8_ != paVar19) {
            operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,
                            CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                     local_58.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0.name._M_dataplus._M_p != &local_c0.name.field_2) {
            operator_delete(local_c0.name._M_dataplus._M_p,
                            CONCAT71(local_c0.name.field_2._M_allocated_capacity._1_7_,
                                     local_c0.name.field_2._M_local_buf[0]) + 1);
          }
          ::wallet::_GLOBAL__N_1::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&local_188);
          std::unique_lock<std::recursive_mutex>::~unique_lock(&local_150);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            _Unwind_Resume(uVar15);
          }
        }
        goto LAB_006a3cd8;
      }
      pcVar16 = (char *)&local_c0;
      tinyformat::format<int,std::__cxx11::string>
                ((string *)local_140,(tinyformat *)"parse error on line %i: %s",(char *)&local_164,
                 (int *)pcVar16,args_1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_140);
      if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
        operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
      }
      sVar17 = local_c0.name._M_string_length;
      if (local_c0.name._M_string_length <
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x2) {
        bVar23 = false;
      }
      else {
        pcVar16 = (char *)0x2;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_78,&local_c0.name,0,2);
        iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_78,"no");
        bVar23 = iVar8 == 0;
      }
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x1 < sVar17) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2)) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if (bVar23) {
        tinyformat::format<std::__cxx11::string>
                  ((string *)local_140,
                   (tinyformat *)", if you intended to specify a negated option, use %s=1 instead",
                   (char *)&local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar16);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (error,(char *)local_140._0_8_,local_140._8_8_);
        uVar15 = local_140._16_8_;
        _Var22._M_p = (pointer)local_140._0_8_;
        if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) goto LAB_006a36ad;
      }
      break;
    }
LAB_006a3301:
    local_164 = local_164 + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.name._M_dataplus._M_p != &local_c0.name.field_2) {
    operator_delete(local_c0.name._M_dataplus._M_p,
                    CONCAT71(local_c0.name.field_2._M_allocated_capacity._1_7_,
                             local_c0.name.field_2._M_local_buf[0]) + 1);
  }
  if ((uVar1 & 5) == 0) {
    bVar23 = false;
  }
  else {
    bVar23 = local_188.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             local_188.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (!bVar23) {
      fmt = local_188.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      ppVar24 = local_188.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      do {
        local_e0[0] = local_d0;
        pcVar3 = (fmt->first)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_e0,pcVar3,pcVar3 + (fmt->first)._M_string_length);
        key._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffe2c;
        key._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffe28;
        key._M_string_length = (size_type)in_stack_fffffffffffffe30;
        key.field_2._M_allocated_capacity = (size_type)error;
        key.field_2._8_8_ = ppVar24;
        InterpretKey(&local_c0,key);
        if (local_e0[0] != local_d0) {
          operator_delete(local_e0[0],local_d0[0] + 1);
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_140,'-',&local_c0.name);
        oVar14 = GetArgFlags(this,(string *)local_140);
        if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
          operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
        }
        bVar7 = IsConfSupported(&local_c0,error);
        if (!bVar7) {
LAB_006a3956:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0.section._M_dataplus._M_p != &local_c0.section.field_2) {
            operator_delete(local_c0.section._M_dataplus._M_p,
                            local_c0.section.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0.name._M_dataplus._M_p != &local_c0.name.field_2) {
            operator_delete(local_c0.name._M_dataplus._M_p,
                            CONCAT71(local_c0.name.field_2._M_allocated_capacity._1_7_,
                                     local_c0.name.field_2._M_local_buf[0]) + 1);
          }
          break;
        }
        if (((ulong)oVar14.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
          if (!ignore_invalid_keys) {
            tinyformat::format<std::__cxx11::string>
                      ((string *)local_140,(tinyformat *)"Invalid configuration value %s",
                       (char *)fmt,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar16)
            ;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_140);
            if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
              operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
            }
            goto LAB_006a3956;
          }
          in_stack_fffffffffffffe28 = (Level)fmt;
          in_stack_fffffffffffffe2c = (undefined4)((ulong)fmt >> 0x20);
          logging_function._M_str = "ReadConfigStream";
          logging_function._M_len = 0x10;
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/common/config.cpp"
          ;
          source_file._M_len = 0x5a;
          pcVar16 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/common/config.cpp"
          ;
          ::LogPrintf_<std::__cxx11::string>
                    (logging_function,source_file,0x6f,
                     IPC|QT|PROXY|PRUNE|CMPCTBLOCK|REINDEX|SELECTCOINS|ESTIMATEFEE|WALLETDB|ZMQ|
                     MEMPOOL|TOR|NET,in_stack_fffffffffffffe28,in_stack_fffffffffffffe30,error);
        }
        else {
          pcVar16 = (char *)((ulong)oVar14.super__Optional_base<unsigned_int,_true,_true>._M_payload
                                    .super__Optional_payload_base<unsigned_int> & 0xffffffff);
          InterpretValue((optional<UniValue> *)local_140,&local_c0,(string *)&fmt->second,
                         oVar14.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                         super__Optional_payload_base<unsigned_int>._M_payload,error);
          if (local_e8 == false) goto LAB_006a3956;
          this_00 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
                    ::operator[](&(this->m_settings).ro_config,&local_c0.section);
          this_01 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                    ::operator[](this_00,&local_c0.name);
          std::vector<UniValue,_std::allocator<UniValue>_>::push_back
                    (this_01,(value_type *)local_140);
          if (local_e8 == true) {
            std::_Optional_payload_base<UniValue>::_M_destroy
                      ((_Optional_payload_base<UniValue> *)local_140);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.section._M_dataplus._M_p != &local_c0.section.field_2) {
          operator_delete(local_c0.section._M_dataplus._M_p,
                          local_c0.section.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.name._M_dataplus._M_p != &local_c0.name.field_2) {
          operator_delete(local_c0.name._M_dataplus._M_p,
                          CONCAT71(local_c0.name.field_2._M_allocated_capacity._1_7_,
                                   local_c0.name.field_2._M_local_buf[0]) + 1);
        }
        fmt = fmt + 1;
        bVar23 = fmt == ppVar24;
      } while (!bVar23);
    }
  }
  ::wallet::_GLOBAL__N_1::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_188);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_150);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar23;
  }
LAB_006a3cd8:
  __stack_chk_fail();
}

Assistant:

bool ArgsManager::ReadConfigStream(std::istream& stream, const std::string& filepath, std::string& error, bool ignore_invalid_keys)
{
    LOCK(cs_args);
    std::vector<std::pair<std::string, std::string>> options;
    if (!GetConfigOptions(stream, filepath, error, options, m_config_sections)) {
        return false;
    }
    for (const std::pair<std::string, std::string>& option : options) {
        KeyInfo key = InterpretKey(option.first);
        std::optional<unsigned int> flags = GetArgFlags('-' + key.name);
        if (!IsConfSupported(key, error)) return false;
        if (flags) {
            std::optional<common::SettingsValue> value = InterpretValue(key, &option.second, *flags, error);
            if (!value) {
                return false;
            }
            m_settings.ro_config[key.section][key.name].push_back(*value);
        } else {
            if (ignore_invalid_keys) {
                LogPrintf("Ignoring unknown configuration value %s\n", option.first);
            } else {
                error = strprintf("Invalid configuration value %s", option.first);
                return false;
            }
        }
    }
    return true;
}